

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O0

uint __thiscall
BTree<EntryBTree,EntryKey>::traverse<EntryUnpacker_const>
          (BTree<EntryBTree,_EntryKey> *this,EntryUnpacker *traverseFunctor)

{
  bool bVar1;
  unsigned_short uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint uVar5;
  uint8_t *puVar6;
  undefined8 *in_RDI;
  EntryKey key;
  uchar *data;
  uint16_t offset;
  uint j;
  uint16_t nextOffset;
  uint high;
  uint i;
  uint visitedKeyCount;
  unsigned_short nodeCount;
  uint offsetAndCount;
  uint8_t *p;
  EntryBTree *self;
  EntryKey *in_stack_00000200;
  EntryUnpacker *in_stack_00000208;
  uint32_t in_stack_ffffffffffffffac;
  uchar **in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffc0;
  uint uVar7;
  undefined2 in_stack_ffffffffffffffc8;
  uint uVar8;
  uint uVar9;
  uchar *local_20;
  
  local_20 = (uchar *)*in_RDI;
  readNextWithByteSwap<unsigned_int,unsigned_char>(in_stack_ffffffffffffffb0);
  uVar2 = readNextWithByteSwap<unsigned_short,unsigned_char>(in_stack_ffffffffffffffb0);
  uVar9 = 0;
  uVar8 = 0;
  do {
    if (uVar2 <= uVar8) {
      return uVar9;
    }
    uVar3 = getBitsAt((uint8_t *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    uVar5 = uVar3 & 0x7ff;
    uVar3 = getBitsAt((uint8_t *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    for (uVar7 = 0; uVar7 < uVar5; uVar7 = uVar7 + 1) {
      uVar4 = getBitsAt((uint8_t *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      advancePointer<unsigned_char>(local_20,(ulong)uVar4);
      EntryKey::EntryKey((EntryKey *)&stack0xffffffffffffffa8);
      puVar6 = EntryBTree::parseData
                         ((EntryBTree *)CONCAT44(uVar9,uVar8),
                          (KeyType *)CONCAT44(uVar5,CONCAT22(uVar3,in_stack_ffffffffffffffc8)),
                          (uint8_t *)CONCAT44(uVar7,CONCAT22(uVar4,in_stack_ffffffffffffffc0)));
      if (puVar6 != (uint8_t *)0x0) {
        uVar9 = uVar9 + 1;
        bVar1 = EntryUnpacker::operator()(in_stack_00000208,in_stack_00000200);
        if (!bVar1) {
          return uVar9;
        }
      }
    }
    local_20 = advancePointer<unsigned_char>(local_20,(ulong)uVar3);
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

unsigned int traverse(TraverseFunctor& traverseFunctor) const
	{
		const auto& self = static_cast<const Derived&>(*this);

		auto p = m_data;
		
		const auto offsetAndCount = readNextWithByteSwap<uint32_t>(p);
		const auto nodeCount = readNextWithByteSwap<uint16_t>(p);
		
		UNUSED(offsetAndCount);
		
		auto visitedKeyCount = 0u;
		for (auto i = 0u; i < nodeCount; ++i) {
			const auto high = getBitsAt(p, 0) & UINT32_C(0x7FF);
			const auto nextOffset = getBitsAt(p, high + 1);
			
			for (auto j = 0u; j < high; ++j) {
				const auto offset = getBitsAt(p, j + 1);
				const auto data = advancePointer(p, offset);
				
				Key key;
				if (self.parseData(key, data)) {
					++visitedKeyCount;
					if (!traverseFunctor(key))
						goto done;
				}
			}
			
			p = advancePointer(p, nextOffset);
		}
		
	done:
		return visitedKeyCount;
	}